

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall doctest::String::operator=(String *this,String *other)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (this != other) {
    if (((this->field_0).buf[0x17] < '\0') &&
       (pcVar2 = (this->field_0).data.ptr, pcVar2 != (char *)0x0)) {
      operator_delete__(pcVar2);
    }
    if ((other->field_0).buf[0x17] < '\0') {
      pcVar2 = allocate(this,(other->field_0).data.size);
      memcpy(pcVar2,(other->field_0).data.ptr,(ulong)(other->field_0).data.size);
    }
    else {
      *(undefined8 *)((long)&this->field_0 + 0x10) = *(undefined8 *)((long)&other->field_0 + 0x10);
      uVar1 = *(undefined8 *)((long)&other->field_0 + 8);
      (this->field_0).data.ptr = (other->field_0).data.ptr;
      *(undefined8 *)((long)&this->field_0 + 8) = uVar1;
    }
  }
  return this;
}

Assistant:

String& String::operator=(const String& other) {
    if(this != &other) {
        if(!isOnStack())
            delete[] data.ptr;

        copy(other);
    }

    return *this;
}